

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_spline.cpp
# Opt level: O2

void __thiscall
chrono::ChFunctionRotation_spline::SetClosed(ChFunctionRotation_spline *this,bool mc)

{
  int iVar1;
  pointer pCVar2;
  size_type sVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  if (this->closed != mc) {
    if (mc) {
      iVar1 = this->p;
      lVar5 = (long)(this->rotations).
                    super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->rotations).
                    super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      sVar3 = (lVar5 >> 5) + (long)iVar1;
      std::vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>::
      resize(&this->rotations,sVar3);
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
                (&(this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                 (long)this->p + 1 + sVar3);
      geometry::ChBasisToolsBspline::ComputeKnotUniform(&this->knots,this->p,0.0,1.0);
      lVar4 = 0;
      for (lVar6 = 0; lVar6 < this->p; lVar6 = lVar6 + 1) {
        pCVar2 = (this->rotations).
                 super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ChQuaternion<double>::operator=
                  ((ChQuaternion<double> *)
                   ((long)pCVar2 + lVar4 + (long)this->p * -0x20 + (long)iVar1 * 0x20 + lVar5),
                   (ChQuaternion<double> *)((long)pCVar2->m_data + lVar4));
        lVar4 = lVar4 + 0x20;
      }
    }
    else {
      sVar3 = ((long)(this->rotations).
                     super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->rotations).
                     super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5) - (long)this->p;
      std::vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>::
      resize(&this->rotations,sVar3);
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
                (&(this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                 (long)this->p + 1 + sVar3);
      geometry::ChBasisToolsBspline::ComputeKnotUniformMultipleEnds(&this->knots,this->p,0.0,1.0);
    }
    this->closed = mc;
  }
  return;
}

Assistant:

void ChFunctionRotation_spline::SetClosed(bool mc) {
	if (this->closed == mc)
		return;

	// switch open->closed
	if (mc == true) {
		// add p control points to be wrapped: resize knots and control points
		auto n = this->rotations.size();
		n += p; 
		this->rotations.resize(n);
		this->knots.setZero(n + p + 1);
		
		// recompute knot vector spacing
        geometry::ChBasisToolsBspline::ComputeKnotUniform(this->knots, p);
		
		// wrap last control points
		for (int i = 0; i < p; ++i)
			this->rotations[n - p + i] = this->rotations[i];
	}
	
	// switch closed->open
	if (mc == false) {
		// remove p control points that was wrapped: resize knots and control points
		auto n = this->rotations.size();
		n -= p; 
		this->rotations.resize(n);
		this->knots.setZero(n + p + 1);

		// recompute knot vector spacing
        geometry::ChBasisToolsBspline::ComputeKnotUniformMultipleEnds(this->knots, p);
	}

	this->closed = mc;
}